

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O3

double __thiscall ON_SubDFace::MaximumEdgeSharpness(ON_SubDFace *this)

{
  unsigned_short uVar1;
  ON_SubDEdgePtr *pOVar2;
  ON_SubDEdgeSharpness OVar3;
  double dVar4;
  bool bVar5;
  ON_SubDEdgePtr *pOVar6;
  unsigned_short uVar7;
  ON_SubDEdge *this_00;
  uint uVar8;
  double local_30;
  
  uVar1 = this->m_edge_count;
  if (uVar1 == 0) {
    local_30 = 0.0;
  }
  else {
    pOVar2 = this->m_edgex;
    pOVar6 = this->m_edge4;
    local_30 = 0.0;
    uVar7 = 0;
    do {
      if (uVar7 == 4) {
        pOVar6 = pOVar2;
      }
      if (uVar7 == 4 && pOVar2 == (ON_SubDEdgePtr *)0x0) {
        return local_30;
      }
      this_00 = (ON_SubDEdge *)(pOVar6->m_ptr & 0xfffffffffffffff8);
      dVar4 = local_30;
      if ((this_00 != (ON_SubDEdge *)0x0) && (bVar5 = ON_SubDEdge::IsSharp(this_00), bVar5)) {
        OVar3 = ON_SubDEdge::Sharpness(this_00,false);
        uVar8 = -(uint)(OVar3.m_edge_sharpness[1] <= OVar3.m_edge_sharpness[0]);
        dVar4 = (double)(float)(~uVar8 & (uint)OVar3.m_edge_sharpness[1] |
                               (uint)OVar3.m_edge_sharpness[0] & uVar8);
        if (dVar4 <= local_30) {
          dVar4 = local_30;
        }
      }
      local_30 = dVar4;
      uVar7 = uVar7 + 1;
      pOVar6 = pOVar6 + 1;
    } while (uVar1 != uVar7);
  }
  return local_30;
}

Assistant:

double ON_SubDFace::MaximumEdgeSharpness() const
{
  double max_edge_sharpness = 0.0;
  const ON_SubDEdgePtr* eptr = m_edge4;
  for (unsigned short fei = 0; fei < m_edge_count; ++fei, ++eptr)
  {
    if (4 == fei)
    {
      eptr = m_edgex;
      if (nullptr == eptr)
        break;
    }
    const ON_SubDEdge* e = ON_SUBD_EDGE_POINTER(eptr->m_ptr);
    if (nullptr == e || false == e->IsSharp())
      continue;
    const ON_SubDEdgeSharpness s = e->Sharpness(false);
    const double m = s.MaximumEndSharpness();
    if (m > max_edge_sharpness)
      max_edge_sharpness = m;
  }
  return max_edge_sharpness;
}